

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::ToString(SQVM *this,SQObjectPtr *o,SQObjectPtr *res)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  SQSharedState *ss;
  bool bVar3;
  uint uVar4;
  SQChar *pSVar5;
  SQChar *pSVar6;
  SQString *x;
  char *__format;
  undefined1 local_38 [8];
  SQObjectPtr closure;
  SQObjectPtr *res_local;
  SQObjectPtr *o_local;
  SQVM *this_local;
  
  SVar1 = (o->super_SQObject)._type;
  closure.super_SQObject._unVal = (SQObjectValue)res;
  if (SVar1 == OT_BOOL) {
    pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,6);
    __format = "false";
    if ((o->super_SQObject)._unVal.pTable != (SQTable *)0x0) {
      __format = "true";
    }
    snprintf(pSVar5,6,__format);
  }
  else if (SVar1 == OT_INTEGER) {
    pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar5,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
  }
  else if (SVar1 == OT_FLOAT) {
    pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar5,0x32,"%g",(double)(o->super_SQObject)._unVal.fFloat);
  }
  else {
    if (SVar1 == OT_STRING) {
      ::SQObjectPtr::operator=(res,o);
      this_local._7_1_ = 1;
      goto LAB_0013f6a5;
    }
    if ((((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) || (SVar1 == OT_INSTANCE)) &&
       ((((o->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)) {
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
      pSVar2 = (o->super_SQObject)._unVal.pTable;
      uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar2,this,0xf,(SQObjectPtr *)local_38);
      if ((uVar4 & 1) == 0) {
LAB_0013f5fa:
        bVar3 = false;
      }
      else {
        Push(this,o);
        bVar3 = CallMetaMethod(this,(SQObjectPtr *)local_38,MT_TOSTRING,1,
                               (SQObjectPtr *)closure.super_SQObject._unVal.pTable);
        if (bVar3) {
          if (*(int *)&((closure.super_SQObject._unVal.pTable)->super_SQDelegable).
                       super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted != 0x8000010)
          goto LAB_0013f5fa;
          this_local._7_1_ = 1;
          bVar3 = true;
        }
        else {
          this_local._7_1_ = 0;
          bVar3 = true;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
      if (bVar3) goto LAB_0013f6a5;
    }
    pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x42);
    pSVar6 = GetTypeName(o);
    snprintf(pSVar5,0x42,"(%s : 0x%p)",pSVar6,(o->super_SQObject)._unVal.pTable);
  }
  ss = this->_sharedstate;
  pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,-1);
  x = SQString::Create(ss,pSVar5,-1);
  ::SQObjectPtr::operator=((SQObjectPtr *)closure.super_SQObject._unVal.pTable,x);
  this_local._7_1_ = 1;
LAB_0013f6a5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::ToString(const SQObjectPtr &o,SQObjectPtr &res)
{
    switch(type(o)) {
    case OT_STRING:
        res = o;
        return true;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_SC("%g"),_float(o));
        break;
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_PRINT_INT_FMT,_integer(o));
        break;
    case OT_BOOL:
        scsprintf(_sp(sq_rsl(6)),sq_rsl(6),_integer(o)?_SC("true"):_SC("false"));
        break;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_TOSTRING, closure)) {
                Push(o);
                if(CallMetaMethod(closure,MT_TOSTRING,1,res)) {
                    if(type(res) == OT_STRING)
                        return true;
                }
                else {
                    return false;
                }
            }
        }
    default:
        scsprintf(_sp(sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR)),sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR),_SC("(%s : 0x%p)"),GetTypeName(o),(void*)_rawval(o));
    }
    res = SQString::Create(_ss(this),_spval);
    return true;
}